

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RegexRuntime.cpp
# Opt level: O0

void __thiscall UnifiedRegex::Matcher::PopStats(Matcher *this,ContStack *contStack,Char *input)

{
  Cont *pCVar1;
  Cont *top;
  Char *input_local;
  ContStack *contStack_local;
  Matcher *this_local;
  
  if (this->stats != (Type)0x0) {
    this->stats->numPops = this->stats->numPops + 1;
  }
  if (this->w != (Type)0x0) {
    pCVar1 = ContinuousPageStackOfVariableElements<UnifiedRegex::Cont,_1UL>::Top
                       (&contStack->
                         super_ContinuousPageStackOfVariableElements<UnifiedRegex::Cont,_1UL>);
    if (pCVar1 == (Cont *)0x0) {
      DebugWriter::PrintEOL(this->w,L"<empty stack>");
    }
    else {
      DebugWriter::Print(this->w,L"POP ");
      (**pCVar1->_vptr_Cont)(pCVar1,this->w,input);
    }
  }
  return;
}

Assistant:

void Matcher::PopStats(ContStack& contStack, const Char* const input) const
    {
        if (stats != 0)
        {
            stats->numPops++;
        }
        if (w != 0)
        {
            const Cont* top = contStack.Top();
            if (top == 0)
                w->PrintEOL(_u("<empty stack>"));
            else
            {
                w->Print(_u("POP "));
                top->Print(w, input);
            }
        }
    }